

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

void __thiscall nonius::standard_reporter::do_estimate_clock_cost_start(standard_reporter *this)

{
  ostream *poVar1;
  long in_RDI;
  
  if ((*(byte *)(in_RDI + 0x30) & 1) != 0) {
    poVar1 = reporter::report_stream((reporter *)0x1eba83);
    std::operator<<(poVar1,"estimating cost of a clock call\n");
  }
  return;
}

Assistant:

void do_estimate_clock_cost_start() override {
            if(verbose) report_stream() << "estimating cost of a clock call\n";
        }